

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.hpp
# Opt level: O2

bool __thiscall units::measurement::operator<=(measurement *this,measurement *other)

{
  bool bVar1;
  double dVar2;
  
  dVar2 = value_as(other,&this->units_);
  if (dVar2 < this->value_) {
    bVar1 = detail::compare_round_equals((float)this->value_,(float)dVar2);
    return bVar1;
  }
  return true;
}

Assistant:

bool operator<=(const measurement& other) const
    {
        auto val = other.value_as(units_);
        return (value_ <= val) ?
            true :
            detail::compare_round_equals(
                static_cast<float>(value_), static_cast<float>(val));
    }